

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

QList<QtGraphicsAnchorLayout::AnchorData_*> *
getVariables(QList<QtGraphicsAnchorLayout::AnchorData_*> *__return_storage_ptr__,
            QList<QSimplexConstraint_*> *constraints)

{
  long lVar1;
  ulong uVar2;
  Data *pDVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  AnchorData *local_50;
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> local_48;
  QHashDummyValue local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  if ((constraints->d).size != 0) {
    uVar4 = 0;
    do {
      pDVar3 = ((constraints->d).ptr[uVar4]->variables).d;
      if (pDVar3 == (Data *)0x0) {
LAB_005cda7a:
        pDVar3 = (Data *)0x0;
LAB_005cda7c:
        uVar5 = 0;
      }
      else {
        if (pDVar3->spans->offsets[0] != 0xff) goto LAB_005cda7c;
        uVar2 = 1;
        do {
          uVar5 = uVar2;
          if (pDVar3->numBuckets == uVar5) goto LAB_005cda7a;
          uVar2 = uVar5 + 1;
        } while (pDVar3->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
      }
LAB_005cdb07:
      if ((uVar5 != 0) || (pDVar3 != (Data *)0x0)) {
        lVar1 = *(long *)pDVar3->spans[uVar5 >> 7].entries
                         [pDVar3->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f]].storage.data;
        local_50 = (AnchorData *)(lVar1 + -8);
        if (lVar1 == 0) {
          local_50 = (AnchorData *)0x0;
        }
        QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::emplace<QHashDummyValue>
                  (&local_48,&local_50,&local_39);
        do {
          if (pDVar3->numBuckets - 1 == uVar5) {
            uVar5 = 0;
            pDVar3 = (Data *)0x0;
            break;
          }
          uVar5 = uVar5 + 1;
        } while (pDVar3->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
        goto LAB_005cdb07;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)(constraints->d).size);
  }
  QSet<QtGraphicsAnchorLayout::AnchorData_*>::values
            (__return_storage_ptr__,(QSet<QtGraphicsAnchorLayout::AnchorData_*> *)&local_48);
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<AnchorData *> getVariables(const QList<QSimplexConstraint *> &constraints)
{
    QSet<AnchorData *> variableSet;
    for (int i = 0; i < constraints.size(); ++i) {
        const QSimplexConstraint *c = constraints.at(i);
        for (auto it = c->variables.cbegin(), end = c->variables.cend(); it != end; ++it)
            variableSet.insert(static_cast<AnchorData *>(it.key()));
    }
    return variableSet.values();
}